

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

int __thiscall QtMWidgets::ToolBarLayout::indexOf(ToolBarLayout *this,QAction *action)

{
  long lVar1;
  long lVar2;
  
  if (0 < (this->buttons).d.size) {
    lVar2 = 0;
    do {
      (**(code **)(*(long *)(this->buttons).d.ptr[lVar2] + 0x68))();
      lVar1 = QMetaObject::cast((QObject *)&ToolButton::staticMetaObject);
      if ((lVar1 != 0) && (*(QAction **)(*(long *)(lVar1 + 0x28) + 8) == action)) {
        return (int)lVar2 + 1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->buttons).d.size);
  }
  return -1;
}

Assistant:

int
ToolBarLayout::indexOf( QAction * action ) const
{
	for( int i = 0; i < buttons.count(); ++i )
	{
		ToolButton * b = qobject_cast< ToolButton* >
			( buttons.at( i )->widget() );

		if( b && b->action() == action )
			return i + 1;
	}

	return -1;
}